

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O2

size_t bssl::dtls_seal_prefix_len(SSL *ssl,uint16_t epoch)

{
  DTLSWriteEpoch *pDVar1;
  size_t sVar2;
  size_t sVar3;
  
  pDVar1 = dtls_get_write_epoch(ssl,epoch);
  if (pDVar1 == (DTLSWriteEpoch *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar2 = dtls_record_header_write_len(ssl,epoch);
    sVar3 = SSLAEADContext::ExplicitNonceLen
                      ((pDVar1->aead)._M_t.
                       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl);
    sVar3 = sVar3 + sVar2;
  }
  return sVar3;
}

Assistant:

size_t dtls_seal_prefix_len(const SSL *ssl, uint16_t epoch) {
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    return 0;
  }
  return dtls_record_header_write_len(ssl, epoch) +
         write_epoch->aead->ExplicitNonceLen();
}